

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr c4::yml::Parser::_prfl(substr buf,flag_t flags)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  uint in_EDX;
  basic_substring<char> *in_RSI;
  long in_RDI;
  ro_substr rVar3;
  csubstr cVar4;
  csubstr fltxt_13;
  csubstr fltxt_12;
  csubstr fltxt_11;
  csubstr fltxt_10;
  csubstr fltxt_9;
  csubstr fltxt_8;
  csubstr fltxt_7;
  csubstr fltxt_6;
  csubstr fltxt_5;
  csubstr fltxt_4;
  csubstr fltxt_3;
  csubstr fltxt_2;
  csubstr fltxt_1;
  csubstr fltxt;
  bool gotone;
  size_t pos;
  size_t in_stack_fffffffffffffb98;
  size_t in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  Location *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  long *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  long *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  Location *pLStack_318;
  char *local_310;
  void *local_308;
  size_t local_300;
  void *local_2f8;
  size_t local_2f0;
  void *local_2e8;
  size_t local_2e0;
  void *local_2d8;
  size_t local_2d0;
  void *local_2c8;
  size_t local_2c0;
  void *local_2b8;
  size_t local_2b0;
  void *local_2a8;
  size_t local_2a0;
  void *local_298;
  size_t local_290;
  void *local_288;
  size_t local_280;
  void *local_278;
  size_t local_270;
  void *local_268;
  size_t local_260;
  void *local_258;
  size_t local_250;
  void *local_248;
  size_t local_240;
  void *local_238;
  size_t local_230;
  char local_221;
  basic_substring<char> *local_220;
  uint local_214;
  long local_210;
  basic_substring<char> *local_208;
  char *local_1f0;
  undefined4 local_1e8;
  basic_substring<char> *local_1e0;
  long *local_1d8;
  char *local_1c0;
  undefined4 local_1b8;
  basic_substring<char> *local_1b0;
  long *local_1a8;
  char *local_1a0;
  undefined4 local_198;
  basic_substring<char> *local_190;
  long *local_188;
  char *local_180;
  undefined4 local_178;
  basic_substring<char> *local_170;
  long *local_168;
  char *local_160;
  undefined4 local_158;
  basic_substring<char> *local_150;
  long *local_148;
  char *local_140;
  undefined4 local_138;
  basic_substring<char> *local_130;
  long *local_128;
  char *local_120;
  undefined4 local_118;
  basic_substring<char> *local_110;
  long *local_108;
  char *local_100;
  undefined4 local_f8;
  basic_substring<char> *local_f0;
  long *local_e8;
  char *local_e0;
  undefined4 local_d8;
  basic_substring<char> *local_d0;
  long *local_c8;
  char *local_c0;
  undefined4 local_b8;
  basic_substring<char> *local_b0;
  long *local_a8;
  char *local_a0;
  undefined4 local_98;
  basic_substring<char> *local_90;
  long *local_88;
  char *local_80;
  undefined4 local_78;
  basic_substring<char> *local_70;
  long *local_68;
  char *local_60;
  undefined4 local_58;
  basic_substring<char> *local_50;
  long *local_48;
  char *local_40;
  undefined4 local_38;
  basic_substring<char> *local_30;
  long *local_28;
  
  local_220 = (basic_substring<char> *)0x0;
  local_221 = '\0';
  local_214 = in_EDX;
  local_210 = in_RDI;
  local_208 = in_RSI;
  if ((in_EDX & 1) == 1) {
    local_220 = (basic_substring<char> *)0x0;
    local_221 = 0;
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_238,(char (*) [5])"RTOP");
    if ((basic_substring<char> *)((long)local_220 + local_230) <= local_208) {
      memcpy((void *)(local_210 + (long)local_220),local_238,local_230);
    }
    local_220 = (basic_substring<char> *)(local_230 + (long)local_220);
    local_221 = '\x01';
  }
  if ((local_214 & 2) == 2) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_28 = &local_210;
        local_30 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_40 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_38 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_30->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_248,(char (*) [5])"RUNK");
    if ((basic_substring<char> *)((long)&local_220->str + local_240) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_248,local_240);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_240);
    local_221 = '\x01';
  }
  if ((local_214 & 4) == 4) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_48 = &local_210;
        local_50 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_60 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_58 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_50->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_258,(char (*) [5])"RMAP");
    if ((basic_substring<char> *)((long)&local_220->str + local_250) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_258,local_250);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_250);
    local_221 = '\x01';
  }
  if ((local_214 & 8) == 8) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_68 = &local_210;
        local_70 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_80 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_78 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_70->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_268,(char (*) [5])"RSEQ");
    if ((basic_substring<char> *)((long)&local_220->str + local_260) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_268,local_260);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_260);
    local_221 = '\x01';
  }
  if ((local_214 & 0x10) == 0x10) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_88 = &local_210;
        local_90 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_98 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_90->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_278,(char (*) [5])"FLOW");
    if ((basic_substring<char> *)((long)&local_220->str + local_270) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_278,local_270);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_270);
    local_221 = '\x01';
  }
  if ((local_214 & 0x20) == 0x20) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_a8 = &local_210;
        local_b0 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b8 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_b0->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_288,(char (*) [5])"QMRK");
    if ((basic_substring<char> *)((long)&local_220->str + local_280) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_288,local_280);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_280);
    local_221 = '\x01';
  }
  if ((local_214 & 0x40) == 0x40) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_c8 = &local_210;
        local_d0 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d8 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_d0->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_298,(char (*) [5])"RKEY");
    if ((basic_substring<char> *)((long)&local_220->str + local_290) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_298,local_290);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_290);
    local_221 = '\x01';
  }
  if ((local_214 & 0x80) == 0x80) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_e8 = &local_210;
        local_f0 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_100 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_f8 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_f0->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_2a8,(char (*) [5])"RVAL");
    if ((basic_substring<char> *)((long)&local_220->str + local_2a0) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_2a8,local_2a0);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_2a0);
    local_221 = '\x01';
  }
  if ((local_214 & 0x100) == 0x100) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_108 = &local_210;
        local_110 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_120 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_118 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_110->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_2b8,(char (*) [5])"RNXT");
    if ((basic_substring<char> *)((long)&local_220->str + local_2b0) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_2b8,local_2b0);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_2b0);
    local_221 = '\x01';
  }
  if ((local_214 & 0x200) == 0x200) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_128 = &local_210;
        local_130 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffc27 = is_debugger_attached(), (bool)in_stack_fffffffffffffc27))
          {
            trap_instruction();
          }
          local_140 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_138 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_130->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_2c8,(char (*) [5])0x35d972);
    if ((basic_substring<char> *)((long)&local_220->str + local_2c0) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_2c8,local_2c0);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_2c0);
    local_221 = '\x01';
  }
  if ((local_214 & 0x400) == 0x400) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        in_stack_fffffffffffffc18 = &local_210;
        local_150 = local_220;
        local_148 = in_stack_fffffffffffffc18;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffc17 = is_debugger_attached(), (bool)in_stack_fffffffffffffc17))
          {
            trap_instruction();
          }
          local_160 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_158 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_150->str + *in_stack_fffffffffffffc18) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_2d8,(char (*) [5])"QSCL");
    if ((basic_substring<char> *)((long)&local_220->str + local_2d0) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_2d8,local_2d0);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_2d0);
    local_221 = '\x01';
  }
  if ((local_214 & 0x800) == 0x800) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        in_stack_fffffffffffffc08 = &local_210;
        local_170 = local_220;
        local_168 = in_stack_fffffffffffffc08;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffc07 = is_debugger_attached(), (bool)in_stack_fffffffffffffc07))
          {
            trap_instruction();
          }
          local_180 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_178 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_170->str + *in_stack_fffffffffffffc08) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_2e8,(char (*) [5])"RSET");
    if ((basic_substring<char> *)((long)&local_220->str + local_2e0) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_2e8,local_2e0);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_2e0);
    local_221 = '\x01';
  }
  if ((local_214 & 0x1000) == 0x1000) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_188 = &local_210;
        local_190 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffbf7 = is_debugger_attached(), (bool)in_stack_fffffffffffffbf7))
          {
            trap_instruction();
          }
          local_1a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_198 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_190->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<5ul>
              ((basic_substring<char_const> *)&local_2f8,(char (*) [5])"NDOC");
    if ((basic_substring<char> *)((long)&local_220->str + local_2f0) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_2f8,local_2f0);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_2f0);
    local_221 = '\x01';
  }
  if ((local_214 & 0x2000) == 0x2000) {
    if (local_221 != '\0') {
      if ((basic_substring<char> *)((long)&local_220->str + 1U) < local_208) {
        local_1a8 = &local_210;
        local_1b0 = local_220;
        if (local_208 <= local_220) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_1c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1b8 = 0x14c3;
          handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        *(undefined1 *)((long)&local_1b0->str + local_210) = 0x7c;
      }
      local_220 = (basic_substring<char> *)((long)&local_220->str + 1);
    }
    basic_substring<char_const>::basic_substring<9ul>
              ((basic_substring<char_const> *)&local_308,(char (*) [9])"RSEQIMAP");
    if ((basic_substring<char> *)((long)&local_220->str + local_300) <= local_208) {
      memcpy((void *)((long)&local_220->str + local_210),local_308,local_300);
    }
    local_220 = (basic_substring<char> *)((long)&local_220->str + local_300);
    local_221 = '\x01';
  }
  if (local_208 < local_220) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
                       ,in_stack_fffffffffffffb98);
    loc.super_LineCol.offset._7_1_ = in_stack_fffffffffffffc07;
    loc.super_LineCol.offset._0_7_ = in_stack_fffffffffffffc00;
    loc.super_LineCol.line = (size_t)in_stack_fffffffffffffc08;
    loc.super_LineCol.col._0_7_ = in_stack_fffffffffffffc10;
    loc.super_LineCol.col._7_1_ = in_stack_fffffffffffffc17;
    loc.name.str = (char *)in_stack_fffffffffffffc18;
    loc.name.len._0_7_ = in_stack_fffffffffffffc20;
    loc.name.len._7_1_ = in_stack_fffffffffffffc27;
    error<29ul>((char (*) [29])CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),loc);
    in_stack_fffffffffffffbb0 = pLStack_318;
    in_stack_fffffffffffffbb8 = local_310;
  }
  local_1d8 = &local_210;
  local_1e0 = local_220;
  if (local_208 < local_220 && local_220 != (basic_substring<char> *)0xffffffffffffffff) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_1f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_1e8 = 0x154e;
    handle_error(0x34984b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
  }
  if (local_1e0 != (basic_substring<char> *)0xffffffffffffffff) {
    local_208 = local_1e0;
  }
  basic_substring<char>::basic_substring
            (local_208,in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
  rVar3 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x322861);
  cVar4.str = rVar3.str;
  cVar4.len = rVar3.len;
  return cVar4;
}

Assistant:

csubstr Parser::_prfl(substr buf, flag_t flags)
{
    size_t pos = 0;
    bool gotone = false;

    #define _prflag(fl)                                     \
    if((flags & fl) == (fl))                                \
    {                                                       \
        if(gotone)                                          \
        {                                                   \
            if(pos + 1 < buf.len)                           \
                buf[pos] = '|';                             \
            ++pos;                                          \
        }                                                   \
        csubstr fltxt = #fl;                                \
        if(pos + fltxt.len <= buf.len)                      \
            memcpy(buf.str + pos, fltxt.str, fltxt.len);    \
        pos += fltxt.len;                                   \
        gotone = true;                                      \
    }

    _prflag(RTOP);
    _prflag(RUNK);
    _prflag(RMAP);
    _prflag(RSEQ);
    _prflag(FLOW);
    _prflag(QMRK);
    _prflag(RKEY);
    _prflag(RVAL);
    _prflag(RNXT);
    _prflag(SSCL);
    _prflag(QSCL);
    _prflag(RSET);
    _prflag(NDOC);
    _prflag(RSEQIMAP);

    #undef _prflag

    RYML_ASSERT(pos <= buf.len);

    return buf.first(pos);
}